

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O0

int __thiscall
HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::remove
          (HashMap<Socket_*,_Socket::Poll::Private::SocketInfo> *this,char *__filename)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  Item *item;
  Iterator *it_local;
  HashMap<Socket_*,_Socket::Poll::Private::SocketInfo> *this_local;
  
  pIVar1 = *(Item **)__filename;
  pIVar2 = pIVar1->nextCell;
  *pIVar1->cell = pIVar2;
  if (pIVar2 != (Item *)0x0) {
    pIVar1->nextCell->cell = pIVar1->cell;
  }
  if (pIVar1->prev == (Item *)0x0) {
    pIVar2 = pIVar1->next;
    (this->_begin).item = pIVar2;
    pIVar2->prev = (Item *)0x0;
  }
  else {
    pIVar2 = pIVar1->prev;
    pIVar3 = pIVar1->next;
    pIVar1->prev->next = pIVar3;
    pIVar3->prev = pIVar2;
  }
  this->_size = this->_size - 1;
  pIVar1->prev = this->freeItem;
  this->freeItem = pIVar1;
  Iterator::Iterator((Iterator *)&this_local,pIVar1->next);
  return (int)this_local;
}

Assistant:

Iterator remove(const Iterator& it)
  {
    Item* item = it.item;

    if((*item->cell = item->nextCell))
      item->nextCell->cell = item->cell;

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;

    --_size;

    item->~Item();
    item->prev = freeItem;
    freeItem = item;
    return item->next;
  }